

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void ColorPhiWeb(VmInstruction *inst,uint color)

{
  uint uVar1;
  VmValue **ppVVar2;
  VmInstruction *pVVar3;
  VmInstruction *pVVar4;
  VmInstruction *pVVar5;
  VmInstruction *source_1;
  VmInstruction *destination_1;
  uint argumentPos_1;
  VmInstruction *instruction_3;
  uint userPos_1;
  VmInstruction *source;
  VmInstruction *destination;
  uint argumentPos;
  VmInstruction *instruction_2;
  uint userPos;
  VmInstruction *instruction_1;
  VmInstruction *instruction;
  uint argument;
  uint color_local;
  VmInstruction *inst_local;
  
  if (inst->color == 0) {
    inst->color = color;
    if (inst->cmd == VM_INST_PHI) {
      for (instruction._0_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&inst->arguments),
          (uint)instruction < uVar1; instruction._0_4_ = (uint)instruction + 2) {
        ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,(uint)instruction);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        ColorPhiWeb(pVVar3,color);
      }
    }
    if (inst->cmd == VM_INST_MOV) {
      ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      ColorPhiWeb(pVVar3,color);
    }
    if (inst->cmd == VM_INST_DEF) {
      for (instruction_2._4_4_ = 0;
          uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
          instruction_2._4_4_ < uVar1; instruction_2._4_4_ = instruction_2._4_4_ + 1) {
        ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(inst->super_VmValue).users,instruction_2._4_4_);
        pVVar3 = getType<VmInstruction>(*ppVVar2);
        if ((pVVar3 != (VmInstruction *)0x0) && (pVVar3->cmd == VM_INST_PARALLEL_COPY)) {
          for (destination._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
              destination._4_4_ < uVar1; destination._4_4_ = destination._4_4_ + 2) {
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination._4_4_);
            pVVar4 = getType<VmInstruction>(*ppVVar2);
            ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                                (&pVVar3->arguments,destination._4_4_ + 1);
            pVVar5 = getType<VmInstruction>(*ppVVar2);
            if (pVVar4 == (VmInstruction *)0x0) {
              __assert_fail("destination",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,6999,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (pVVar5 == (VmInstruction *)0x0) {
              __assert_fail("source",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,7000,"void ColorPhiWeb(VmInstruction *, unsigned int)");
            }
            if (inst == pVVar4) {
              ColorPhiWeb(pVVar5,color);
            }
          }
        }
      }
    }
    for (instruction_3._4_4_ = 0;
        uVar1 = SmallArray<VmValue_*,_8U>::size(&(inst->super_VmValue).users),
        instruction_3._4_4_ < uVar1; instruction_3._4_4_ = instruction_3._4_4_ + 1) {
      ppVVar2 = SmallArray<VmValue_*,_8U>::operator[]
                          (&(inst->super_VmValue).users,instruction_3._4_4_);
      pVVar3 = getType<VmInstruction>(*ppVVar2);
      if (pVVar3->cmd == VM_INST_PHI) {
        ColorPhiWeb(pVVar3,color);
      }
      if (pVVar3->cmd == VM_INST_MOV) {
        ColorPhiWeb(pVVar3,color);
      }
      if (pVVar3->cmd == VM_INST_PARALLEL_COPY) {
        for (destination_1._4_4_ = 0; uVar1 = SmallArray<VmValue_*,_4U>::size(&pVVar3->arguments),
            destination_1._4_4_ < uVar1; destination_1._4_4_ = destination_1._4_4_ + 2) {
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,destination_1._4_4_);
          pVVar4 = getType<VmInstruction>(*ppVVar2);
          ppVVar2 = SmallArray<VmValue_*,_4U>::operator[]
                              (&pVVar3->arguments,destination_1._4_4_ + 1);
          pVVar5 = getType<VmInstruction>(*ppVVar2);
          if (pVVar4 == (VmInstruction *)0x0) {
            __assert_fail("destination",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1b72,"void ColorPhiWeb(VmInstruction *, unsigned int)");
          }
          if (pVVar5 == (VmInstruction *)0x0) {
            __assert_fail("source",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1b73,"void ColorPhiWeb(VmInstruction *, unsigned int)");
          }
          if (inst == pVVar5) {
            ColorPhiWeb(pVVar4,color);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ColorPhiWeb(VmInstruction *inst, unsigned color)
{
	if(inst->color != 0)
		return;

	inst->color = color;

	if(inst->cmd == VM_INST_PHI)
	{
		for(unsigned argument = 0; argument < inst->arguments.size(); argument += 2)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->arguments[argument]);

			ColorPhiWeb(instruction, color);
		}
	}

	if(inst->cmd == VM_INST_MOV)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->arguments[0]);

		ColorPhiWeb(instruction, color);
	}

	if(inst->cmd == VM_INST_DEF)
	{
		for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
		{
			VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

			if(instruction && instruction->cmd == VM_INST_PARALLEL_COPY)
			{
				for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
				{
					VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
					VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

					assert(destination);
					assert(source);

					if(inst == destination)
						ColorPhiWeb(source, color);
				}
			}
		}
	}

	for(unsigned userPos = 0; userPos < inst->users.size(); userPos++)
	{
		VmInstruction *instruction = getType<VmInstruction>(inst->users[userPos]);

		if(instruction->cmd == VM_INST_PHI)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_MOV)
			ColorPhiWeb(instruction, color);

		if(instruction->cmd == VM_INST_PARALLEL_COPY)
		{
			for(unsigned argumentPos = 0; argumentPos < instruction->arguments.size(); argumentPos += 2)
			{
				VmInstruction *destination = getType<VmInstruction>(instruction->arguments[argumentPos]);
				VmInstruction *source = getType<VmInstruction>(instruction->arguments[argumentPos + 1]);

				assert(destination);
				assert(source);

				if(inst == source)
					ColorPhiWeb(destination, color);
			}
		}
	}
}